

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clustergraph.h
# Opt level: O0

vector<unsigned_long,_std::allocator<unsigned_long>_> * __thiscall
libDAI::ClusterGraph::ind_delta(ClusterGraph *this,size_t i)

{
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_RSI;
  ClusterGraph *in_RDI;
  iterator it;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *result;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffff78;
  BipartiteGraph<libDAI::Var,_libDAI::VarSet> *in_stack_ffffffffffffff80;
  const_iterator __first;
  
  __first._M_current = (unsigned_long *)in_RDI;
  BipartiteGraph<libDAI::Var,_libDAI::VarSet>::V1
            (in_stack_ffffffffffffff80,(size_t)in_stack_ffffffffffffff78);
  ind_Delta((ClusterGraph *)__first._M_current,(Var *)in_RSI._M_current);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(in_stack_ffffffffffffff78);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(in_stack_ffffffffffffff78);
  std::
  find<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,unsigned_long>
            ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )__first._M_current,in_RSI,(unsigned_long *)in_RDI);
  __gnu_cxx::
  __normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>::
  __normal_iterator<unsigned_long*>
            ((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              *)in_stack_ffffffffffffff80,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              *)in_stack_ffffffffffffff78);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::erase
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_RSI._M_current,__first);
  return (vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_RDI;
}

Assistant:

std::vector<size_t> ind_delta( size_t i ) const {
                std::vector<size_t> result = ind_Delta( V1(i) );
                std::vector<size_t>::iterator it = find( result.begin(), result.end(), i );
                result.erase( it );
                return result;
            }